

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int __thiscall NULLCFile::FilePrint(NULLCFile *this,NULLCArray arr,File *file)

{
  size_t sVar1;
  long lVar2;
  uint local_38;
  uint local_34;
  uint length;
  File *file_local;
  NULLCArray arr_local;
  
  lVar2 = CONCAT44((int)((ulong)register0x00000010 >> 0x20),arr.len);
  if (lVar2 == 0) {
    nullcThrowError("ERROR: null pointer access");
    arr_local.ptr._4_4_ = 0;
  }
  else if (*(long *)(lVar2 + 4) == 0) {
    nullcThrowError("Cannot write to a closed file.");
    arr_local.ptr._4_4_ = 0;
  }
  else {
    for (local_34 = 0; (local_34 < (uint)arr.ptr && (this[local_34] != (NULLCFile)0x0));
        local_34 = local_34 + 1) {
    }
    if (this == (NULLCFile *)0x0) {
      local_38 = 0;
    }
    else {
      sVar1 = fwrite(this,1,(ulong)local_34,*(FILE **)(lVar2 + 4));
      local_38 = (uint)(local_34 == sVar1);
    }
    arr_local.ptr._4_4_ = local_38;
  }
  return arr_local.ptr._4_4_;
}

Assistant:

int FilePrint(NULLCArray arr, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		unsigned length = 0;
		for(; length < arr.len; length++)
		{
			if(!arr.ptr[length])
				break;
		}

		return arr.ptr ? length == fwrite(arr.ptr, 1, length, file->handle) : 0;
	}